

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O3

void __thiscall DetectorSS::Copybmp(DetectorSS *this,uchar *dst,uchar *src,int start,int len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  if (0 < len) {
    uVar1 = 0;
    do {
      uVar3 = uVar1 + start & 7;
      uVar4 = uVar1 & 7;
      uVar2 = 0xffU >> uVar3 & (uint)src[(int)(uVar1 + start) >> 3];
      iVar5 = (int)uVar1 >> 3;
      if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
        dst[iVar5] = dst[iVar5] | (byte)(uVar2 >> (uVar4 - uVar3 & 0x1f));
        uVar1 = uVar1 & 0xfffffff8;
      }
      else {
        dst[iVar5] = dst[iVar5] | (byte)(uVar2 << (uVar3 - uVar4 & 0x1f));
        uVar1 = uVar1 - uVar3;
      }
      uVar1 = uVar1 + 8;
    } while ((int)uVar1 < len);
  }
  return;
}

Assistant:

void DetectorSS::Copybmp(unsigned char* dst, unsigned char* src, int start, int len) {
	int curlen = 0;
	while (curlen < len) {
		unsigned char temp = 0;
		int n = start + curlen;
		int index = n >> 3;
		int pos = n & 0x07;
		int pos2 = curlen & 0x07;
		if ((8 - pos2) > (8 - pos)) {
			temp |= src[index] & (0xff >> pos);
			temp <<= (pos - pos2);
			dst[curlen >> 3] |= temp;
			curlen += 8 - pos;
		}
		else {
			temp |= src[index] & (0xff >> pos);
			temp >>= (pos2 - pos);
			dst[curlen >> 3] |= temp;
			curlen += 8 - pos2;
		}
	}
}